

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::GetThreadCount(cmCPackArchiveGenerator *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_d1;
  string local_d0;
  cmValue local_b0;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  cmValue local_58 [3];
  allocator<char> local_39;
  string local_38;
  int local_14;
  cmCPackArchiveGenerator *pcStack_10;
  int threads;
  cmCPackArchiveGenerator *this_local;
  
  local_14 = 1;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CPACK_ARCHIVE_THREADS",&local_39);
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CPACK_ARCHIVE_THREADS",&local_79);
    local_58[0] = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_78);
    psVar2 = cmValue::operator_cast_to_string_(local_58);
    local_14 = std::__cxx11::stoi(psVar2,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CPACK_THREADS",&local_a1);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"CPACK_THREADS",&local_d1);
      local_b0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_d0);
      psVar2 = cmValue::operator_cast_to_string_(&local_b0);
      local_14 = std::__cxx11::stoi(psVar2,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
  }
  return local_14;
}

Assistant:

int cmCPackArchiveGenerator::GetThreadCount() const
{
  int threads = 1;

  // CPACK_ARCHIVE_THREADS overrides CPACK_THREADS
  if (this->IsSet("CPACK_ARCHIVE_THREADS")) {
    threads = std::stoi(this->GetOption("CPACK_ARCHIVE_THREADS"));
  } else if (this->IsSet("CPACK_THREADS")) {
    threads = std::stoi(this->GetOption("CPACK_THREADS"));
  }

  return threads;
}